

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::InvertSSBOInPlaceCase::InvertSSBOInPlaceCase
          (InvertSSBOInPlaceCase *this,Context *context,char *name,char *description,int numValues,
          bool isSized,IVec3 *localSize,IVec3 *workSize)

{
  undefined7 in_register_00000089;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,"Read and write same SSBO");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e622b8;
  this->m_numValues = (int)description;
  this->m_isSized = SUB41(numValues,0);
  tcu::Vector<int,_3>::Vector
            (&this->m_localSize,(Vector<int,_3> *)CONCAT71(in_register_00000089,isSized));
  tcu::Vector<int,_3>::Vector(&this->m_workSize,localSize);
  return;
}

Assistant:

InvertSSBOInPlaceCase (Context& context, const char* name, const char* description, int numValues, bool isSized, const tcu::IVec3& localSize, const tcu::IVec3& workSize)
		: TestCase		(context, name, description)
		, m_numValues	(numValues)
		, m_isSized		(isSized)
		, m_localSize	(localSize)
		, m_workSize	(workSize)
	{
		DE_ASSERT(m_numValues % (m_workSize[0]*m_workSize[1]*m_workSize[2]*m_localSize[0]*m_localSize[1]*m_localSize[2]) == 0);
	}